

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilsFORTRAN_wrap.cxx
# Opt level: O2

void msleep(int ms)

{
  domain_error *this;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  
  if (-1 < ms) {
    local_18.__r = (rep)(uint)ms;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_18);
    return;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,"Invalid sleep time");
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void msleep(int ms) {
    if (ms < 0)
        throw std::domain_error("Invalid sleep time");
    std::this_thread::sleep_for(std::chrono::milliseconds(ms));
}